

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref_init
                    (ma_format format,ma_uint32 channels,void *pData,ma_uint64 sizeInFrames,
                    ma_audio_buffer_ref *pAudioBufferRef)

{
  ma_data_source_config pDataSource;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  void *in_R8;
  ma_data_source_config dataSourceConfig;
  ma_result result;
  ma_result local_14;
  
  if (in_R8 == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_R8 != (void *)0x0) {
      memset(in_R8,0,0x70);
    }
    pDataSource = ma_data_source_config_init();
    local_14 = ma_data_source_init((ma_data_source_config *)
                                   &g_ma_audio_buffer_ref_data_source_vtable,pDataSource.vtable);
    if (local_14 == MA_SUCCESS) {
      *(undefined4 *)((long)in_R8 + 0x48) = in_EDI;
      *(undefined4 *)((long)in_R8 + 0x4c) = in_ESI;
      *(undefined4 *)((long)in_R8 + 0x50) = 0;
      *(undefined8 *)((long)in_R8 + 0x58) = 0;
      *(undefined8 *)((long)in_R8 + 0x60) = in_RCX;
      *(undefined8 *)((long)in_R8 + 0x68) = in_RDX;
      local_14 = MA_SUCCESS;
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_init(ma_format format, ma_uint32 channels, const void* pData, ma_uint64 sizeInFrames, ma_audio_buffer_ref* pAudioBufferRef)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pAudioBufferRef);

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_audio_buffer_ref_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pAudioBufferRef->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pAudioBufferRef->format       = format;
    pAudioBufferRef->channels     = channels;
    pAudioBufferRef->sampleRate   = 0;  /* TODO: Version 0.12. Set this to sampleRate. */
    pAudioBufferRef->cursor       = 0;
    pAudioBufferRef->sizeInFrames = sizeInFrames;
    pAudioBufferRef->pData        = pData;

    return MA_SUCCESS;
}